

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

bool __thiscall clickhouse::Client::Impl::ReceiveException(Impl *this,bool rethrow)

{
  CodedInputStream *this_00;
  __uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> __ptr;
  QueryEvents *pQVar1;
  bool bVar2;
  _Head_base<0UL,_clickhouse::Exception_*,_false> _Var3;
  ServerException *this_01;
  undefined7 in_register_00000031;
  _Head_base<0UL,_clickhouse::Exception_*,_false> buffer;
  bool has_nested;
  uint64_t len;
  char local_51;
  _Head_base<0UL,_clickhouse::Exception_*,_false> local_50;
  ulong local_48;
  __uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000031,rethrow);
  local_50._M_head_impl = (Exception *)operator_new(0x70);
  *(undefined4 *)local_50._M_head_impl = 0;
  *(undefined4 **)((long)local_50._M_head_impl + 8) =
       (undefined4 *)((long)local_50._M_head_impl + 0x18);
  *(undefined8 *)((long)local_50._M_head_impl + 0x10) = 0;
  *(undefined1 *)((long)local_50._M_head_impl + 0x18) = 0;
  *(undefined4 **)((long)local_50._M_head_impl + 0x28) =
       (undefined4 *)((long)local_50._M_head_impl + 0x38);
  *(undefined8 *)((long)local_50._M_head_impl + 0x30) = 0;
  *(undefined1 *)((long)local_50._M_head_impl + 0x38) = 0;
  *(undefined4 **)((long)local_50._M_head_impl + 0x48) =
       (undefined4 *)((long)local_50._M_head_impl + 0x58);
  *(undefined8 *)((long)local_50._M_head_impl + 0x50) = 0;
  *(undefined1 *)((long)local_50._M_head_impl + 0x58) = 0;
  *(undefined8 *)((long)local_50._M_head_impl + 0x68) = 0;
  this_00 = &this->input_;
  _Var3._M_head_impl = local_50._M_head_impl;
  while( true ) {
    buffer._M_head_impl = _Var3._M_head_impl;
    local_51 = '\0';
    bVar2 = CodedInputStream::ReadRaw(this_00,buffer._M_head_impl,4);
    if (((!bVar2) || (bVar2 = CodedInputStream::ReadVarint64(this_00,&local_48), !bVar2)) ||
       (0xffffff < local_48)) break;
    std::__cxx11::string::resize((ulong)&(buffer._M_head_impl)->name,(char)local_48);
    bVar2 = CodedInputStream::ReadRaw
                      (this_00,((buffer._M_head_impl)->name)._M_dataplus._M_p,local_48);
    if (((!bVar2) || (bVar2 = CodedInputStream::ReadVarint64(this_00,&local_48), !bVar2)) ||
       (0xffffff < local_48)) break;
    std::__cxx11::string::resize((ulong)&(buffer._M_head_impl)->display_text,(char)local_48);
    bVar2 = CodedInputStream::ReadRaw
                      (this_00,((buffer._M_head_impl)->display_text)._M_dataplus._M_p,local_48);
    if (((!bVar2) || (bVar2 = CodedInputStream::ReadVarint64(this_00,&local_48), !bVar2)) ||
       (0xffffff < local_48)) break;
    std::__cxx11::string::resize((ulong)&(buffer._M_head_impl)->stack_trace,(char)local_48);
    bVar2 = CodedInputStream::ReadRaw
                      (this_00,((buffer._M_head_impl)->stack_trace)._M_dataplus._M_p,local_48);
    if ((!bVar2) || (bVar2 = CodedInputStream::ReadRaw(this_00,&local_51,1), !bVar2)) break;
    if (local_51 != '\x01') {
      pQVar1 = this->events_;
      if (pQVar1 != (QueryEvents *)0x0) {
        (*pQVar1->_vptr_QueryEvents[5])(pQVar1,local_50._M_head_impl);
      }
      if (((char)local_34 != '\0') || (bVar2 = true, (this->options_).rethrow_exceptions == true)) {
        this_01 = (ServerException *)__cxa_allocate_exception(0x18);
        local_40._M_t.
        super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
        .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
             (tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
             (tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
             local_50._M_head_impl;
        local_50._M_head_impl = (Exception *)0x0;
        ServerException::ServerException
                  (this_01,(unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            *)&local_40);
        __cxa_throw(this_01,&ServerException::typeinfo,ServerException::~ServerException);
      }
      goto LAB_0015153f;
    }
    _Var3._M_head_impl = (Exception *)operator_new(0x70);
    *(undefined4 *)_Var3._M_head_impl = 0;
    *(undefined4 **)((long)_Var3._M_head_impl + 8) = (undefined4 *)((long)_Var3._M_head_impl + 0x18)
    ;
    *(undefined8 *)((long)_Var3._M_head_impl + 0x10) = 0;
    *(undefined1 *)((long)_Var3._M_head_impl + 0x18) = 0;
    *(undefined4 **)((long)_Var3._M_head_impl + 0x28) =
         (undefined4 *)((long)_Var3._M_head_impl + 0x38);
    *(undefined8 *)((long)_Var3._M_head_impl + 0x30) = 0;
    *(undefined1 *)((long)_Var3._M_head_impl + 0x38) = 0;
    *(undefined4 **)((long)_Var3._M_head_impl + 0x48) =
         (undefined4 *)((long)_Var3._M_head_impl + 0x58);
    *(undefined8 *)((long)_Var3._M_head_impl + 0x50) = 0;
    *(undefined1 *)((long)_Var3._M_head_impl + 0x58) = 0;
    *(undefined8 *)((long)_Var3._M_head_impl + 0x68) = 0;
    __ptr._M_t.
    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>.
    super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
         ((buffer._M_head_impl)->nested)._M_t.
         super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>.
         _M_t;
    ((buffer._M_head_impl)->nested)._M_t.
    super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>._M_t =
         (tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
         _Var3._M_head_impl;
    if ((_Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
        __ptr._M_t.
        super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
        .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl != (Exception *)0x0) {
      std::default_delete<clickhouse::Exception>::operator()
                ((default_delete<clickhouse::Exception> *)&(buffer._M_head_impl)->nested,
                 (Exception *)
                 __ptr._M_t.
                 super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                 .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl);
      _Var3._M_head_impl =
           (Exception *)
           *(_Head_base<0UL,_clickhouse::Exception_*,_false> *)&(buffer._M_head_impl)->nested;
    }
  }
  bVar2 = false;
LAB_0015153f:
  if (local_50._M_head_impl != (Exception *)0x0) {
    std::default_delete<clickhouse::Exception>::operator()
              ((default_delete<clickhouse::Exception> *)&local_50,local_50._M_head_impl);
  }
  return bVar2;
}

Assistant:

bool Client::Impl::ReceiveException(bool rethrow) {
    std::unique_ptr<Exception> e(new Exception);
    Exception* current = e.get();

    do {
        bool has_nested = false;

        if (!WireFormat::ReadFixed(&input_, &current->code)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->name)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->display_text)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->stack_trace)) {
            return false;
        }
        if (!WireFormat::ReadFixed(&input_, &has_nested)) {
            return false;
        }

        if (has_nested) {
            current->nested.reset(new Exception);
            current = current->nested.get();
        } else {
            break;
        }
    } while (true);

    if (events_) {
        events_->OnServerException(*e);
    }

    if (rethrow || options_.rethrow_exceptions) {
        throw ServerException(std::move(e));
    }

    return true;
}